

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int reparse_unary_expr(ly_ctx *ctx,lyxp_expr *exp,uint16_t *exp_idx)

{
  uint16_t exp_idx_00;
  uint16_t exp_idx_01;
  int iVar1;
  
  exp_idx_00 = *exp_idx;
  exp_idx_01 = exp_idx_00;
  while (((exp->used != exp_idx_01 && (exp->tokens[exp_idx_01] == LYXP_TOKEN_OPERATOR_MATH)) &&
         (exp->expr[exp->expr_pos[exp_idx_01]] == '-'))) {
    exp_repeat_push(exp,exp_idx_00,7);
    exp_idx_01 = *exp_idx + 1;
    *exp_idx = exp_idx_01;
  }
  iVar1 = reparse_path_expr(ctx,exp,exp_idx);
  while( true ) {
    if (iVar1 != 0) {
      return -1;
    }
    if (exp->used == *exp_idx) break;
    if (exp->tokens[*exp_idx] != LYXP_TOKEN_OPERATOR_UNI) {
      return 0;
    }
    exp_repeat_push(exp,exp_idx_01,8);
    *exp_idx = *exp_idx + 1;
    iVar1 = reparse_path_expr(ctx,exp,exp_idx);
  }
  return 0;
}

Assistant:

static int
reparse_unary_expr(struct ly_ctx *ctx, struct lyxp_expr *exp, uint16_t *exp_idx)
{
    uint16_t prev_exp;

    /* ('-')* */
    prev_exp = *exp_idx;
    while (!exp_check_token(ctx, exp, *exp_idx, LYXP_TOKEN_OPERATOR_MATH, 0)
            && (exp->expr[exp->expr_pos[*exp_idx]] == '-')) {
        exp_repeat_push(exp, prev_exp, LYXP_EXPR_UNARY);
        ++(*exp_idx);
    }

    /* PathExpr */
    prev_exp = *exp_idx;
    if (reparse_path_expr(ctx, exp, exp_idx)) {
        return -1;
    }

    /* ('|' PathExpr)* */
    while (!exp_check_token(ctx, exp, *exp_idx, LYXP_TOKEN_OPERATOR_UNI, 0)) {
        exp_repeat_push(exp, prev_exp, LYXP_EXPR_UNION);
        ++(*exp_idx);

        if (reparse_path_expr(ctx, exp, exp_idx)) {
            return -1;
        }
    }

    return EXIT_SUCCESS;
}